

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEObservation.cpp
# Opt level: O2

bool __thiscall test_CEObservation::test_obj_return(test_CEObservation *this)

{
  undefined1 uVar1;
  CEBody *pCVar2;
  CEDate *pCVar3;
  CEObserver *pCVar4;
  CEDate test_date;
  CEObserver test_observer;
  CEBody test_body;
  CEObservation test1;
  allocator local_1fd;
  undefined4 local_1fc;
  CEDate local_1f8;
  string local_1b8 [32];
  CEObserver local_198;
  CEBody local_e8;
  CEObservation local_98;
  
  CEObservation::CEObservation(&local_98,&this->base_obs_);
  pCVar2 = CEObservation::Body(&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"test_obj_return",(allocator *)&local_1f8);
  local_e8.super_CESkyCoord._vptr_CESkyCoord._0_4_ = 0x7d;
  (**(code **)(*(long *)this + 0x48))(this,pCVar2 != (CEBody *)0x0,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1f8);
  pCVar2 = CEObservation::Body(&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"test_obj_return",(allocator *)&local_1f8);
  local_e8.super_CESkyCoord._vptr_CESkyCoord._0_4_ = 0x7e;
  (**(code **)(*(long *)this + 0x48))(this,pCVar2 == &this->base_body_,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1f8);
  pCVar3 = CEObservation::Date(&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"test_obj_return",(allocator *)&local_1f8);
  local_e8.super_CESkyCoord._vptr_CESkyCoord._0_4_ = 0x7f;
  (**(code **)(*(long *)this + 0x48))(this,pCVar3 != (CEDate *)0x0,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1f8);
  pCVar3 = CEObservation::Date(&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"test_obj_return",(allocator *)&local_1f8);
  local_e8.super_CESkyCoord._vptr_CESkyCoord._0_4_ = 0x80;
  (**(code **)(*(long *)this + 0x48))(this,pCVar3 == &this->base_date_,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1f8);
  pCVar4 = CEObservation::Observer(&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"test_obj_return",(allocator *)&local_1f8);
  local_e8.super_CESkyCoord._vptr_CESkyCoord._0_4_ = 0x81;
  (**(code **)(*(long *)this + 0x48))(this,pCVar4 != (CEObserver *)0x0,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1f8);
  pCVar4 = CEObservation::Observer(&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"test_obj_return",(allocator *)&local_1f8);
  local_e8.super_CESkyCoord._vptr_CESkyCoord._0_4_ = 0x82;
  (**(code **)(*(long *)this + 0x48))(this,pCVar4 == &this->base_observer_,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"",(allocator *)&local_1f8);
  CEBody::CEBody(&local_e8,&this->base_body_,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1f8);
  CEDate::CEDate(&local_1f8,&this->base_date_);
  CEObserver::CEObserver(&local_198,&this->base_observer_);
  CEObservation::SetBody(&local_98,&local_e8);
  CEObservation::SetDate(&local_98,&local_1f8);
  CEObservation::SetObserver(&local_98,&local_198);
  pCVar2 = CEObservation::Body(&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"test_obj_return",&local_1fd);
  local_1fc = 0x8f;
  (**(code **)(*(long *)this + 0x48))(this,pCVar2 != (CEBody *)0x0,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1fd);
  pCVar3 = CEObservation::Date(&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"test_obj_return",&local_1fd);
  local_1fc = 0x90;
  (**(code **)(*(long *)this + 0x48))(this,pCVar3 != (CEDate *)0x0,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1fd);
  pCVar4 = CEObservation::Observer(&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"test_obj_return",&local_1fd);
  local_1fc = 0x91;
  (**(code **)(*(long *)this + 0x48))(this,pCVar4 != (CEObserver *)0x0,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1fd);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  CEObserver::~CEObserver(&local_198);
  CEDate::~CEDate(&local_1f8);
  CEBody::~CEBody(&local_e8);
  CEObservation::~CEObservation(&local_98);
  return (bool)uVar1;
}

Assistant:

bool test_CEObservation::test_obj_return(void)
{
    // Test getting the pointers to the objects
    CEObservation test1 = base_obs_;
    test(test1.Body() != nullptr, __func__, __LINE__);
    test(test1.Body() == &base_body_, __func__, __LINE__);
    test(test1.Date() != nullptr, __func__, __LINE__);
    test(test1.Date() == &base_date_, __func__, __LINE__);
    test(test1.Observer() != nullptr, __func__, __LINE__);
    test(test1.Observer() == &base_observer_, __func__, __LINE__);

    // Copy base objects for testing (the pointers will be different)
    CEBody     test_body(base_body_);
    CEDate     test_date(base_date_);
    CEObserver test_observer(base_observer_);

    // Now reset the pointers
    test1.SetBody(&test_body);
    test1.SetDate(&test_date);
    test1.SetObserver(&test_observer);

    // Test that the pointers have been reset
    test(test1.Body() != nullptr, __func__, __LINE__);
    test(test1.Date() != nullptr, __func__, __LINE__);
    test(test1.Observer() != nullptr, __func__, __LINE__);

    return pass();
}